

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

ProString * __thiscall
VcprojGenerator::firstInputFileName(VcprojGenerator *this,ProString *extraCompilerName)

{
  bool bVar1;
  iterator o;
  QMakeProject *in_RDI;
  long in_FS_OFFSET;
  ProStringList *files;
  ProString *var;
  ProStringList *__range1;
  iterator __end1;
  iterator __begin1;
  ProString *in_stack_ffffffffffffff38;
  QMakeProject *this_00;
  iterator local_50;
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_48 = ::operator+((ProString *)in_RDI,(char (*) [7])in_stack_ffffffffffffff38);
  ProKey::ProKey<ProString_const&,char_const(&)[7]>
            ((ProKey *)this_00,
             (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)in_stack_ffffffffffffff38);
  QMakeProject::values(this_00,(ProKey *)in_stack_ffffffffffffff38);
  ProKey::~ProKey((ProKey *)0x28a367);
  local_50.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_50 = QList<ProString>::begin((QList<ProString> *)this_00);
  o = QList<ProString>::end((QList<ProString> *)this_00);
  do {
    bVar1 = QList<ProString>::iterator::operator!=(&local_50,o);
    if (!bVar1) {
      ProString::ProString((ProString *)this_00);
LAB_0028a460:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (ProString *)in_RDI;
      }
      __stack_chk_fail();
    }
    QList<ProString>::iterator::operator*(&local_50);
    QMakeProject::values(this_00,(ProKey *)in_stack_ffffffffffffff38);
    bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x28a428);
    if (!bVar1) {
      QList<ProString>::first((QList<ProString> *)this_00);
      ProString::ProString((ProString *)this_00,in_stack_ffffffffffffff38);
      goto LAB_0028a460;
    }
    QList<ProString>::iterator::operator++(&local_50);
  } while( true );
}

Assistant:

ProString VcprojGenerator::firstInputFileName(const ProString &extraCompilerName) const
{
    for (const ProString &var : project->values(ProKey(extraCompilerName + ".input"))) {
        const ProStringList &files = project->values(var.toKey());
        if (!files.isEmpty())
            return files.first();
    }
    return ProString();
}